

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_type_is_local(lys_type *type)

{
  lys_module *plVar1;
  lys_module *plVar2;
  lys_type *type_local;
  
  if (type->der->module == (lys_module *)0x0) {
    type_local._4_4_ = 1;
  }
  else {
    plVar1 = lys_main_module(type->der->module);
    plVar2 = lys_main_module(type->parent->module);
    type_local._4_4_ = (uint)(plVar1 == plVar2);
  }
  return type_local._4_4_;
}

Assistant:

int
lys_type_is_local(const struct lys_type *type)
{
    if (!type->der->module) {
        /* build-in type */
        return 1;
    }
    /* type->parent can be either a typedef or leaf/leaf-list, but module pointers are compatible */
    return (lys_main_module(type->der->module) == lys_main_module(((struct lys_tpdf *)type->parent)->module));
}